

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaParseLocalAttributes
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr *child,
              xmlSchemaItemListPtr *list,int parentType,int *hasRefs)

{
  int iVar1;
  xmlSchemaItemListPtr pxVar2;
  bool bVar3;
  xmlSchemaQNameRefPtr local_48;
  void *item;
  int *hasRefs_local;
  int parentType_local;
  xmlSchemaItemListPtr *list_local;
  xmlNodePtr *child_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  do {
    if (((*child == (xmlNodePtr)0x0) || ((*child)->ns == (xmlNs *)0x0)) ||
       (iVar1 = xmlStrEqual((*child)->name,"attribute"), iVar1 == 0)) {
LAB_001e39db:
      bVar3 = false;
      if ((*child != (xmlNodePtr)0x0) && (bVar3 = false, (*child)->ns != (xmlNs *)0x0)) {
        iVar1 = xmlStrEqual((*child)->name,(xmlChar *)"attributeGroup");
        bVar3 = false;
        if (iVar1 != 0) {
          iVar1 = xmlStrEqual((*child)->ns->href,xmlSchemaNs);
          bVar3 = iVar1 != 0;
        }
      }
    }
    else {
      iVar1 = xmlStrEqual((*child)->ns->href,xmlSchemaNs);
      bVar3 = true;
      if (iVar1 == 0) goto LAB_001e39db;
    }
    if (!bVar3) {
      return 0;
    }
    if (((*child == (xmlNodePtr)0x0) || ((*child)->ns == (xmlNs *)0x0)) ||
       ((iVar1 = xmlStrEqual((*child)->name,"attribute"), iVar1 == 0 ||
        (iVar1 = xmlStrEqual((*child)->ns->href,xmlSchemaNs), iVar1 == 0)))) {
      local_48 = xmlSchemaParseAttributeGroupRef(ctxt,schema,*child);
      if ((local_48 != (xmlSchemaQNameRefPtr)0x0) && (hasRefs != (int *)0x0)) {
        *hasRefs = 1;
      }
    }
    else {
      local_48 = (xmlSchemaQNameRefPtr)
                 xmlSchemaParseLocalAttribute(ctxt,schema,*child,*list,parentType);
    }
    if (local_48 != (xmlSchemaQNameRefPtr)0x0) {
      if (*list == (xmlSchemaItemListPtr)0x0) {
        pxVar2 = xmlSchemaItemListCreate();
        *list = pxVar2;
        if (*list == (xmlSchemaItemListPtr)0x0) {
          return -1;
        }
      }
      iVar1 = xmlSchemaItemListAddSize(*list,2,local_48);
      if (iVar1 == -1) {
        return -1;
      }
    }
    *child = (*child)->next;
  } while( true );
}

Assistant:

static int
xmlSchemaParseLocalAttributes(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                        xmlNodePtr *child, xmlSchemaItemListPtr *list,
			int parentType, int *hasRefs)
{
    void *item;

    while ((IS_SCHEMA((*child), "attribute")) ||
           (IS_SCHEMA((*child), "attributeGroup"))) {
        if (IS_SCHEMA((*child), "attribute")) {
	    item = xmlSchemaParseLocalAttribute(ctxt, schema, *child,
		*list, parentType);
        } else {
            item = xmlSchemaParseAttributeGroupRef(ctxt, schema, *child);
	    if ((item != NULL) && (hasRefs != NULL))
		*hasRefs = 1;
        }
	if (item != NULL) {
	    if (*list == NULL) {
		/* TODO: Customize grow factor. */
		*list = xmlSchemaItemListCreate();
		if (*list == NULL)
		    return(-1);
	    }
	    if (xmlSchemaItemListAddSize(*list, 2, item) == -1)
		return(-1);
	}
        *child = (*child)->next;
    }
    return (0);
}